

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_truncated_poisson_dist.hpp
# Opt level: O2

void __thiscall
trng::zero_truncated_poisson_dist::param_type::param_type(param_type *this,double mu)

{
  this->mu_ = mu;
  (this->P_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->P_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->P_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  calc_probabilities(this);
  return;
}

Assistant:

explicit param_type(double mu) : mu_{mu} { calc_probabilities(); }